

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uefifind.cpp
# Opt level: O1

USTATUS __thiscall
UEFIFind::findFileRecursive
          (UEFIFind *this,UModelIndex index,CBString *hexPattern,UINT8 mode,
          set<std::pair<UModelIndex,_UModelIndex>,_std::less<std::pair<UModelIndex,_UModelIndex>_>,_std::allocator<std::pair<UModelIndex,_UModelIndex>_>_>
          *files)

{
  undefined1 *puVar1;
  UModelIndex index_00;
  UByteArray *pUVar2;
  bool bVar3;
  UINT8 UVar4;
  int iVar5;
  int iVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  INTN IVar8;
  long lVar9;
  int i;
  int __c;
  long lVar10;
  USTATUS UVar11;
  UModelIndex parentFile;
  UByteArray data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> patternMask;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pattern;
  undefined1 local_118 [32];
  uint64_t uStack_f8;
  TreeModel *pTStack_f0;
  UByteArray local_e8;
  UByteArray local_c8;
  UINT8 *local_a8;
  undefined8 local_a0;
  UINT8 local_98 [16];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  TreeModel local_48;
  TreeModel *local_38;
  
  if (index.r < 0) {
    return 0;
  }
  if (index.c < 0) {
    return 0;
  }
  if (index.m == (TreeModel *)0x0) {
    return 0;
  }
  if ((hexPattern->super_tagbstring).slen == 0) {
    return 1;
  }
  local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (UINT8 *)0x0;
  local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (UINT8 *)0x0;
  local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (UINT8 *)0x0;
  bVar3 = makePattern((CHAR8 *)(hexPattern->super_tagbstring).data,&local_68,&local_88);
  UVar11 = 1;
  if (!bVar3) goto LAB_0010be74;
  lVar9 = 0;
  if (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start) {
    lVar10 = 0;
    do {
      lVar9 = lVar9 + (ulong)(local_88.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start[lVar10] == '\0');
      lVar10 = lVar10 + 1;
    } while ((long)local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start != lVar10);
  }
  if (lVar9 != (long)local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start) {
    iVar5 = TreeModel::rowCount(this->model,&index);
    for (__c = 0; iVar6 = TreeModel::rowCount(this->model,&index), __c < iVar6; __c = __c + 1) {
      TreeModel::index(&local_48,(char *)index.m,__c);
      index_00.i._0_1_ = local_48.markingEnabledFlag;
      index_00.i._1_1_ = local_48.markingDarkModeFlag;
      index_00.i._2_6_ = local_48._10_6_;
      index_00._0_8_ = local_48.rootItem;
      index_00.m = local_38;
      findFileRecursive(this,index_00,hexPattern,mode,files);
    }
    local_a0 = 0;
    local_98[0] = '\0';
    local_a8 = local_98;
    if (iVar5 < 1) {
      if (mode == '\x02') {
        TreeModel::body((UByteArray *)local_118,this->model,&index);
        std::__cxx11::string::_M_assign((string *)&local_a8);
      }
      else {
        if (mode != '\x01') {
          TreeModel::header(&local_c8,this->model,&index);
          TreeModel::body(&local_e8,this->model,&index);
          operator+((UByteArray *)local_118,&local_c8,&local_e8);
          std::__cxx11::string::_M_assign((string *)&local_a8);
          goto LAB_0010bcab;
        }
        TreeModel::header((UByteArray *)local_118,this->model,&index);
        std::__cxx11::string::_M_assign((string *)&local_a8);
      }
LAB_0010bc4f:
      pUVar2 = (UByteArray *)local_118;
LAB_0010bcd9:
      paVar7 = &(pUVar2->d).field_2;
      puVar1 = (undefined1 *)(&paVar7->_M_allocated_capacity)[-2];
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar1 != paVar7) {
        operator_delete(puVar1);
      }
    }
    else {
      if (mode == '\x03') {
        TreeModel::header(&local_c8,this->model,&index);
        TreeModel::body(&local_e8,this->model,&index);
        operator+((UByteArray *)local_118,&local_c8,&local_e8);
        std::__cxx11::string::_M_assign((string *)&local_a8);
LAB_0010bcab:
        if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
          operator_delete((void *)local_118._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8.d._M_dataplus._M_p != &local_e8.d.field_2) {
          operator_delete(local_e8.d._M_dataplus._M_p);
        }
        pUVar2 = &local_c8;
        goto LAB_0010bcd9;
      }
      if (mode == '\x01') {
        TreeModel::header((UByteArray *)local_118,this->model,&index);
        std::__cxx11::string::_M_assign((string *)&local_a8);
        goto LAB_0010bc4f;
      }
    }
    IVar8 = findPattern(local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_68.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_68.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,local_a8,(long)(int)local_a0,
                        0);
    bVar3 = true;
    if (mode == '\x03' && 0 < iVar5) {
      TreeModel::header(&local_c8,this->model,&index);
      bVar3 = IVar8 < (int)local_c8.d._M_string_length;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.d._M_dataplus._M_p != &local_c8.d.field_2) {
        operator_delete(local_c8.d._M_dataplus._M_p);
      }
    }
    if ((bool)(-1 < IVar8 & bVar3)) {
      UVar4 = TreeModel::type(this->model,&index);
      if (UVar4 == 'B') {
        uStack_f8 = 0;
        pTStack_f0 = (TreeModel *)0x0;
        local_118._0_8_ = CONCAT44(index.c,index.r);
        local_118._8_8_ = index.i;
        local_118._16_8_ = index.m;
        local_118._24_8_ = 0xffffffffffffffff;
        std::
        _Rb_tree<std::pair<UModelIndex,UModelIndex>,std::pair<UModelIndex,UModelIndex>,std::_Identity<std::pair<UModelIndex,UModelIndex>>,std::less<std::pair<UModelIndex,UModelIndex>>,std::allocator<std::pair<UModelIndex,UModelIndex>>>
        ::_M_insert_unique<std::pair<UModelIndex,UModelIndex>>
                  ((_Rb_tree<std::pair<UModelIndex,UModelIndex>,std::pair<UModelIndex,UModelIndex>,std::_Identity<std::pair<UModelIndex,UModelIndex>>,std::less<std::pair<UModelIndex,UModelIndex>>,std::allocator<std::pair<UModelIndex,UModelIndex>>>
                    *)files,(pair<UModelIndex,_UModelIndex> *)local_118);
      }
      else {
        TreeModel::findParentOfType((UModelIndex *)&local_e8,this->model,&index,'B');
        UVar4 = TreeModel::type(this->model,&index);
        if ((UVar4 == 'C') && (UVar4 = TreeModel::subtype(this->model,&index), UVar4 == '\x18')) {
          local_118._16_8_ = local_e8.d.field_2._M_allocated_capacity;
          local_118._0_8_ = local_e8.d._M_dataplus._M_p;
          local_118._8_8_ = local_e8.d._M_string_length;
          local_118._24_8_ = CONCAT44(index.c,index.r);
          uStack_f8 = index.i;
          pTStack_f0 = index.m;
          std::
          _Rb_tree<std::pair<UModelIndex,UModelIndex>,std::pair<UModelIndex,UModelIndex>,std::_Identity<std::pair<UModelIndex,UModelIndex>>,std::less<std::pair<UModelIndex,UModelIndex>>,std::allocator<std::pair<UModelIndex,UModelIndex>>>
          ::_M_insert_unique<std::pair<UModelIndex,UModelIndex>>
                    ((_Rb_tree<std::pair<UModelIndex,UModelIndex>,std::pair<UModelIndex,UModelIndex>,std::_Identity<std::pair<UModelIndex,UModelIndex>>,std::less<std::pair<UModelIndex,UModelIndex>>,std::allocator<std::pair<UModelIndex,UModelIndex>>>
                      *)files,(pair<UModelIndex,_UModelIndex> *)local_118);
        }
        else {
          uStack_f8 = 0;
          pTStack_f0 = (TreeModel *)0x0;
          local_118._0_8_ = local_e8.d._M_dataplus._M_p;
          local_118._8_8_ = local_e8.d._M_string_length;
          local_118._16_8_ = local_e8.d.field_2._M_allocated_capacity;
          local_118._24_8_ = 0xffffffffffffffff;
          std::
          _Rb_tree<std::pair<UModelIndex,UModelIndex>,std::pair<UModelIndex,UModelIndex>,std::_Identity<std::pair<UModelIndex,UModelIndex>>,std::less<std::pair<UModelIndex,UModelIndex>>,std::allocator<std::pair<UModelIndex,UModelIndex>>>
          ::_M_insert_unique<std::pair<UModelIndex,UModelIndex>>
                    ((_Rb_tree<std::pair<UModelIndex,UModelIndex>,std::pair<UModelIndex,UModelIndex>,std::_Identity<std::pair<UModelIndex,UModelIndex>>,std::less<std::pair<UModelIndex,UModelIndex>>,std::allocator<std::pair<UModelIndex,UModelIndex>>>
                      *)files,(pair<UModelIndex,_UModelIndex> *)local_118);
        }
      }
    }
    if (local_a8 != local_98) {
      operator_delete(local_a8);
    }
  }
  UVar11 = 0;
LAB_0010be74:
  if (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (UINT8 *)0x0) {
    operator_delete(local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (UINT8 *)0x0) {
    operator_delete(local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return UVar11;
}

Assistant:

USTATUS UEFIFind::findFileRecursive(const UModelIndex index, const UString & hexPattern, const UINT8 mode, std::set<std::pair<UModelIndex, UModelIndex> > & files)
{
    if (!index.isValid())
        return U_SUCCESS;

    if (hexPattern.isEmpty())
        return U_INVALID_PARAMETER;

    const char *hexPatternRaw = hexPattern.toLocal8Bit();
    std::vector<UINT8> pattern, patternMask;
    if (!makePattern(hexPatternRaw, pattern, patternMask))
        return U_INVALID_PARAMETER;

    // Check for "all substrings" pattern
    size_t count = 0;
    for (size_t i = 0; i < patternMask.size(); i++)
        if (patternMask[i] == 0)
            count++;
    if (count == patternMask.size())
        return U_SUCCESS;

    bool hasChildren = (model->rowCount(index) > 0);
    for (int i = 0; i < model->rowCount(index); i++) {
        findFileRecursive(index.model()->index(i, index.column(), index), hexPattern, mode, files);
    }

    // TODO: handle a case where an item has both compressed and uncompressed bodies
    UByteArray data;
    if (hasChildren) {
        if (mode == SEARCH_MODE_HEADER)
            data = model->header(index);
        else if (mode == SEARCH_MODE_ALL)
            data = model->header(index) + model->body(index);
    }
    else {
        if (mode == SEARCH_MODE_HEADER)
            data = model->header(index);
        else if (mode == SEARCH_MODE_BODY)
            data = model->body(index);
        else
            data = model->header(index) + model->body(index);
    }

    const UINT8 *rawData = reinterpret_cast<const UINT8 *>(data.constData());
    INTN offset = findPattern(pattern.data(), patternMask.data(), pattern.size(), rawData, data.size(), 0);

    // For patterns that cross header|body boundary, skip patterns entirely located in body, since
    // children search above has already found them.
    if (hasChildren && mode == SEARCH_MODE_ALL && offset >= model->header(index).size()) {
        offset = -1;
    }

    if (offset >= 0) {
        if (model->type(index) != Types::File) {
            UModelIndex parentFile = model->findParentOfType(index, Types::File);
            if (model->type(index) == Types::Section && model->subtype(index) == EFI_SECTION_FREEFORM_SUBTYPE_GUID)
                files.insert(std::pair<UModelIndex, UModelIndex>(parentFile, index));
            else
                files.insert(std::pair<UModelIndex, UModelIndex>(parentFile, UModelIndex()));
        }
        else {
            files.insert(std::pair<UModelIndex, UModelIndex>(index, UModelIndex()));
        }
    }

    return U_SUCCESS;
}